

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,duckdb::uhugeint_t>
          (BaseAppender *this,Vector *col,uchar input)

{
  data_ptr_t pdVar1;
  long lVar2;
  uhugeint_t uVar3;
  
  uVar3 = Cast::Operation<unsigned_char,duckdb::uhugeint_t>(input);
  pdVar1 = col->data;
  lVar2 = (this->chunk).count * 0x10;
  *(uint64_t *)(pdVar1 + lVar2) = uVar3.lower;
  *(uint64_t *)(pdVar1 + lVar2 + 8) = uVar3.upper;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}